

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Endpoints.cpp
# Opt level: O3

ssize_t __thiscall
helics::Endpoint::send(Endpoint *this,int __fd,void *__buf,size_t __n,int __flags)

{
  uint uVar1;
  Core *pCVar2;
  int iVar3;
  undefined4 extraout_var;
  ssize_t extraout_RAX;
  InvalidFunctionCall *this_00;
  pointer *__ptr;
  undefined4 in_register_00000034;
  long *plVar5;
  string_view message;
  Message *local_18;
  ssize_t sVar4;
  
  plVar5 = (long *)CONCAT44(in_register_00000034,__fd);
  if ((this->fed->_vptr_MessageFederate[-3][(long)&(this->fed->mfManager)._M_t] != (_func_int)0x2)
     && (this->fed->_vptr_MessageFederate[-3][(long)&(this->fed->mfManager)._M_t] != (_func_int)0x1)
     ) {
    this_00 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
    message._M_str = "messages not allowed outside of execution and initialization mode";
    message._M_len = 0x41;
    InvalidFunctionCall::InvalidFunctionCall(this_00,message);
    __cxa_throw(this_00,&InvalidFunctionCall::typeinfo,HelicsException::~HelicsException);
  }
  local_18 = (Message *)*plVar5;
  if ((local_18->dest)._M_string_length == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&local_18->dest,&this->defDest);
    local_18 = (Message *)*plVar5;
  }
  pCVar2 = (this->super_Interface).mCore;
  uVar1 = (this->super_Interface).handle.hid;
  *plVar5 = 0;
  iVar3 = (*pCVar2->_vptr_Core[0x4e])(pCVar2,(ulong)uVar1);
  sVar4 = CONCAT44(extraout_var,iVar3);
  if (local_18 != (Message *)0x0) {
    std::default_delete<helics::Message>::operator()
              ((default_delete<helics::Message> *)&local_18,local_18);
    sVar4 = extraout_RAX;
  }
  return sVar4;
}

Assistant:

void Endpoint::send(std::unique_ptr<Message> mess) const
{
    if ((fed->getCurrentMode() == Federate::Modes::EXECUTING) ||
        (fed->getCurrentMode() == Federate::Modes::INITIALIZING)) {
        if (mess->dest.empty()) {
            mess->dest = defDest;
        }
        mCore->sendMessage(handle, std::move(mess));
    } else {
        throw(InvalidFunctionCall(
            "messages not allowed outside of execution and initialization mode"));
    }
}